

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_PKH(DisasContext_conflict1 *s,arg_PKH *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  int32_t local_3c;
  int shift;
  TCGv_i32 tm;
  TCGv_i32 tn;
  TCGContext_conflict1 *tcg_ctx;
  arg_PKH *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  local_3c = a->imm;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,3);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    ret = load_reg(s,a->rn);
    ret_00 = load_reg(s,a->rm);
    if (a->tb == 0) {
      tcg_gen_shli_i32_aarch64(tcg_ctx_00,ret_00,ret_00,local_3c);
      tcg_gen_deposit_i32_aarch64(tcg_ctx_00,ret,ret_00,ret,0,0x10);
    }
    else {
      if (local_3c == 0) {
        local_3c = 0x1f;
      }
      tcg_gen_sari_i32_aarch64(tcg_ctx_00,ret_00,ret_00,local_3c);
      tcg_gen_deposit_i32_aarch64(tcg_ctx_00,ret,ret,ret_00,0,0x10);
    }
    tcg_temp_free_i32(tcg_ctx_00,ret_00);
    store_reg(s,a->rd,ret);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_PKH(DisasContext *s, arg_PKH *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tn, tm;
    int shift = a->imm;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    tn = load_reg(s, a->rn);
    tm = load_reg(s, a->rm);
    if (a->tb) {
        /* PKHTB */
        if (shift == 0) {
            shift = 31;
        }
        tcg_gen_sari_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tn, tm, 0, 16);
    } else {
        /* PKHBT */
        tcg_gen_shli_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tm, tn, 0, 16);
    }
    tcg_temp_free_i32(tcg_ctx, tm);
    store_reg(s, a->rd, tn);
    return true;
}